

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O0

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::finalize
          (iterated_hash<crypto::sha1_transform> *this,char *result)

{
  uint *in_RSI;
  iterated_hash<crypto::sha1_transform> *in_RDI;
  iterated_hash<crypto::sha1_transform> *unaff_retaddr;
  size_t size;
  size_t order;
  char *in_stack_00000028;
  hash_word *in_stack_00000030;
  char *buffer;
  size_t count;
  
  count = 4;
  buffer = (char *)0x38;
  pad(unaff_retaddr,(size_t)in_RDI,(char)((ulong)in_RSI >> 0x38));
  bit_count_lo(in_RDI);
  util::endianness<util::big_endian>::store<unsigned_int>
            ((uint)((ulong)buffer >> 0x20),in_RDI->buffer);
  bit_count_hi(in_RDI);
  util::endianness<util::big_endian>::store<unsigned_int>
            ((uint)((ulong)buffer >> 0x20),in_RDI->buffer);
  hash(in_stack_00000030,in_stack_00000028,(size_t)this);
  util::endianness<util::big_endian>::store<unsigned_int>(in_RSI,count,buffer);
  return;
}

Assistant:

void iterated_hash<T>::finalize(char * result) {
	
	size_t order = transform::offset * sizeof(hash_word);
	
	size_t size = block_size - 2 * sizeof(hash_word);
	pad(size);
	byte_order::store(bit_count_lo(), buffer + size + order);
	byte_order::store(bit_count_hi(), buffer + size + sizeof(hash_word) - order);
	
	hash(state, buffer, block_size);
	
	byte_order::store(state, hash_size, result);
	
}